

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall cs_impl::any::detach(any *this)

{
  proxy *ppVar1;
  error *this_00;
  allocator local_31;
  string local_30;
  
  ppVar1 = this->mDat;
  if (ppVar1 == (proxy *)0x0) {
    return;
  }
  if (ppVar1->protect_level < 3) {
    (*ppVar1->data->_vptr_baseHolder[8])();
    return;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"E000L",&local_31);
  cov::error::error(this_00,&local_30);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

void detach() const
		{
			if (this->mDat != nullptr) {
				if (this->mDat->protect_level > 2)
					throw cov::error("E000L");
				this->mDat->data->detach();
			}
		}